

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_calc_binningd(fitsfile *fptr,int naxis,char (*colname) [71],double *minin,double *maxin,
                      double *binsizein,char (*minname) [71],char (*maxname) [71],
                      char (*binname) [71],int *colnum,long *haxes,double *amin,double *amax,
                      double *binsize,int *status)

{
  int iVar1;
  double *in_stack_000002e8;
  double *in_stack_000002f0;
  char **in_stack_000002f8;
  char (*in_stack_00000300) [71];
  int in_stack_0000030c;
  fitsfile *in_stack_00000310;
  double *in_stack_00000330;
  char (*in_stack_00000338) [71];
  char (*in_stack_00000340) [71];
  char (*in_stack_00000348) [71];
  int *in_stack_00000350;
  int *in_stack_00000358;
  long *in_stack_00000360;
  double *in_stack_00000368;
  double *in_stack_00000370;
  double *in_stack_00000378;
  long *in_stack_00000380;
  int *in_stack_00000388;
  
  iVar1 = fits_calc_binningde(in_stack_00000310,in_stack_0000030c,in_stack_00000300,
                              in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,
                              in_stack_00000330,in_stack_00000338,in_stack_00000340,
                              in_stack_00000348,in_stack_00000350,in_stack_00000358,
                              in_stack_00000360,in_stack_00000368,in_stack_00000370,
                              in_stack_00000378,in_stack_00000380,in_stack_00000388);
  return iVar1;
}

Assistant:

int fits_calc_binningd(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      long *haxes,     /* O - number of bins in each histogram axis */
      double *amin,     /* O - lower bound of the histogram axes */
      double *amax,     /* O - upper bound of the histogram axes */
      double *binsize,  /* O - width of histogram bins/pixels on each axis */
      int *status)
/*
  Calculate the actual binning parameters, non-extended-syntax version
*/
{
  return fits_calc_binningde(fptr, naxis, colname, 0, 
			     minin, maxin, binsizein, 
			     minname, maxname, binname, 
			     colnum, 0, haxes, amin, amax, binsize, 0, 
			     status);
}